

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark-multi-accept.c
# Opt level: O0

int test_tcp(uint num_servers,uint num_clients)

{
  int iVar1;
  uv_loop_t *puVar2;
  server_ctx *servers_00;
  void *__ptr;
  server_ctx *arg;
  uv_tcp_t *tcp;
  uint64_t uVar3;
  uint64_t uVar4;
  long lVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  server_ctx *ctx_3;
  server_ctx *ctx_2;
  uint64_t t;
  client_ctx *ctx_1;
  server_ctx *ctx;
  void *eval_b_1;
  void *eval_a_1;
  void *eval_b;
  void *eval_a;
  double time;
  uint i;
  uv_tcp_t *handle;
  uv_loop_t *loop;
  client_ctx *clients;
  server_ctx *servers;
  uint num_clients_local;
  uint num_servers_local;
  
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,&listen_addr);
  if (iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x172,"0 == uv_ip4_addr(\"127.0.0.1\", TEST_PORT, &listen_addr)");
    abort();
  }
  puVar2 = uv_default_loop();
  servers_00 = (server_ctx *)calloc((ulong)num_servers,0x1b8);
  __ptr = calloc((ulong)num_clients,0x1e8);
  if (servers_00 == (server_ctx *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x177,"servers","!=","NULL",0,"!=",0);
    abort();
  }
  if (__ptr == (void *)0x0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%p %s %p)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
            ,0x178,"clients","!=","NULL",0,"!=",0);
    abort();
  }
  time._4_4_ = 0;
  while( true ) {
    if (num_servers <= time._4_4_) {
      send_listen_handles(UV_TCP,num_servers,servers_00);
      time._4_4_ = 0;
      while( true ) {
        if (num_clients <= time._4_4_) {
          uVar3 = uv_hrtime();
          iVar1 = uv_run(puVar2,UV_RUN_DEFAULT);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
                    ,0x195,"0 == uv_run(loop, UV_RUN_DEFAULT)");
            abort();
          }
          uVar4 = uv_hrtime();
          lVar5 = uVar4 - uVar3;
          auVar7._8_4_ = (int)((ulong)lVar5 >> 0x20);
          auVar7._0_8_ = lVar5;
          auVar7._12_4_ = 0x45300000;
          dVar6 = ((auVar7._8_8_ - 1.9342813113834067e+25) +
                  ((double)CONCAT44(0x43300000,(int)lVar5) - 4503599627370496.0)) / 1000000000.0;
          for (time._4_4_ = 0; time._4_4_ < num_servers; time._4_4_ = time._4_4_ + 1) {
            uv_async_send(&servers_00[time._4_4_].async_handle);
            iVar1 = uv_thread_join(&servers_00[time._4_4_].thread_id);
            if (iVar1 != 0) {
              fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
                      ,0x19d,"0 == uv_thread_join(&ctx->thread_id)");
              abort();
            }
            uv_sem_destroy(&servers_00[time._4_4_].semaphore);
          }
          printf("accept%u: %.0f accepts/sec (%u total)\n",250000.0 / dVar6,(ulong)num_servers,
                 250000);
          for (time._4_4_ = 0; time._4_4_ < num_servers; time._4_4_ = time._4_4_ + 1) {
            dVar8 = (double)servers_00[time._4_4_].num_connects;
            printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",dVar8 / dVar6,
                   (dVar8 * 100.0) / 250000.0,(ulong)time._4_4_,
                   (ulong)servers_00[time._4_4_].num_connects);
          }
          free(__ptr);
          free(servers_00);
          puVar2 = uv_default_loop();
          close_loop(puVar2);
          puVar2 = uv_default_loop();
          iVar1 = uv_loop_close(puVar2);
          if (iVar1 != 0) {
            fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
                    ,0x1b2,"0 == uv_loop_close(uv_default_loop())");
            abort();
          }
          uv_library_shutdown();
          return 0;
        }
        tcp = (uv_tcp_t *)((long)__ptr + (ulong)time._4_4_ * 0x1e8);
        tcp[1].type = (uv_handle_type)(250000 / (ulong)num_clients);
        tcp->data = "client handle";
        iVar1 = uv_tcp_init(puVar2,tcp);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
                  ,0x18b,"0 == uv_tcp_init(loop, handle)");
          abort();
        }
        iVar1 = uv_tcp_connect((uv_connect_t *)&tcp[1].close_cb,tcp,(sockaddr *)&listen_addr,
                               cl_connect_cb);
        if (iVar1 != 0) break;
        iVar1 = uv_idle_init(puVar2,(uv_idle_t *)&tcp[1].connect_req);
        if (iVar1 != 0) {
          fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
                  ,400,"0 == uv_idle_init(loop, &ctx->idle_handle)");
          abort();
        }
        time._4_4_ = time._4_4_ + 1;
      }
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
              ,399,
              "0 == uv_tcp_connect(&ctx->connect_req, handle, (const struct sockaddr*) &listen_addr, cl_connect_cb)"
             );
      abort();
    }
    arg = servers_00 + time._4_4_;
    iVar1 = uv_sem_init(&arg->semaphore,0);
    if (iVar1 != 0) {
      fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
              ,0x180,"0 == uv_sem_init(&ctx->semaphore, 0)");
      abort();
    }
    iVar1 = uv_thread_create(&arg->thread_id,server_cb,arg);
    if (iVar1 != 0) break;
    time._4_4_ = time._4_4_ + 1;
  }
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/neovim[P]libuv/test/benchmark-multi-accept.c"
          ,0x181,"0 == uv_thread_create(&ctx->thread_id, server_cb, ctx)");
  abort();
}

Assistant:

static int test_tcp(unsigned int num_servers, unsigned int num_clients) {
  struct server_ctx* servers;
  struct client_ctx* clients;
  uv_loop_t* loop;
  uv_tcp_t* handle;
  unsigned int i;
  double time;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &listen_addr));
  loop = uv_default_loop();

  servers = calloc(num_servers, sizeof(servers[0]));
  clients = calloc(num_clients, sizeof(clients[0]));
  ASSERT_NOT_NULL(servers);
  ASSERT_NOT_NULL(clients);

  /* We're making the assumption here that from the perspective of the
   * OS scheduler, threads are functionally equivalent to and interchangeable
   * with full-blown processes.
   */
  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    ASSERT(0 == uv_sem_init(&ctx->semaphore, 0));
    ASSERT(0 == uv_thread_create(&ctx->thread_id, server_cb, ctx));
  }

  send_listen_handles(UV_TCP, num_servers, servers);

  for (i = 0; i < num_clients; i++) {
    struct client_ctx* ctx = clients + i;
    ctx->num_connects = NUM_CONNECTS / num_clients;
    handle = (uv_tcp_t*) &ctx->client_handle;
    handle->data = "client handle";
    ASSERT(0 == uv_tcp_init(loop, handle));
    ASSERT(0 == uv_tcp_connect(&ctx->connect_req,
                               handle,
                               (const struct sockaddr*) &listen_addr,
                               cl_connect_cb));
    ASSERT(0 == uv_idle_init(loop, &ctx->idle_handle));
  }

  {
    uint64_t t = uv_hrtime();
    ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));
    t = uv_hrtime() - t;
    time = t / 1e9;
  }

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    uv_async_send(&ctx->async_handle);
    ASSERT(0 == uv_thread_join(&ctx->thread_id));
    uv_sem_destroy(&ctx->semaphore);
  }

  printf("accept%u: %.0f accepts/sec (%u total)\n",
         num_servers,
         NUM_CONNECTS / time,
         NUM_CONNECTS);

  for (i = 0; i < num_servers; i++) {
    struct server_ctx* ctx = servers + i;
    printf("  thread #%u: %.0f accepts/sec (%u total, %.1f%%)\n",
           i,
           ctx->num_connects / time,
           ctx->num_connects,
           ctx->num_connects * 100.0 / NUM_CONNECTS);
  }

  free(clients);
  free(servers);

  MAKE_VALGRIND_HAPPY();
  return 0;
}